

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeMessageDelimiter
          (ParserImpl *this,string *delimiter)

{
  bool bVar1;
  string local_48;
  allocator local_21;
  
  std::__cxx11::string::string((string *)&local_48,"<",&local_21);
  bVar1 = TryConsume(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_48,"{",&local_21);
    bVar1 = Consume(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (!bVar1) {
      return false;
    }
  }
  std::__cxx11::string::assign((char *)delimiter);
  return true;
}

Assistant:

bool ConsumeMessageDelimiter(std::string* delimiter) {
    if (TryConsume("<")) {
      *delimiter = ">";
    } else {
      DO(Consume("{"));
      *delimiter = "}";
    }
    return true;
  }